

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::testCaseEnded(JunitReporter *this,TestCaseStats *testCaseStats)

{
  long in_RSI;
  long in_RDI;
  TestCaseStats *in_stack_00000028;
  CumulativeReporterBase *in_stack_00000030;
  
  std::operator<<((ostream *)(in_RDI + 0x118),(string *)(in_RSI + 0x148));
  std::operator<<((ostream *)(in_RDI + 0x290),(string *)(in_RSI + 0x168));
  CumulativeReporterBase::testCaseEnded(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) CATCH_OVERRIDE {
            stdOutForSuite << testCaseStats.stdOut;
            stdErrForSuite << testCaseStats.stdErr;
            CumulativeReporterBase::testCaseEnded( testCaseStats );
        }